

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O2

ItemFlags __thiscall QUrlModel::flags(QUrlModel *this,QModelIndex *index)

{
  QFlagsStorage<Qt::ItemFlag> QVar1;
  QFlagsStorage<Qt::ItemFlag> QVar2;
  bool bVar3;
  char cVar4;
  uint uVar5;
  long in_FS_OFFSET;
  QVariant QStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = QStandardItemModel::flags((QModelIndex *)this);
  bVar3 = QModelIndex::isValid(index);
  QVar1.i = uVar5 & 0xfffffff5;
  if (!bVar3) {
    QVar1.i = uVar5;
  }
  QModelIndex::data(&QStack_48,index,1);
  cVar4 = ::QVariant::isNull();
  ::QVariant::~QVariant(&QStack_48);
  QVar2.i = QVar1.i & 0xffffffdf;
  if (cVar4 == '\0') {
    QVar2.i = QVar1.i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QFlagsStorageHelper<Qt::ItemFlag,_4>)(QFlagsStorageHelper<Qt::ItemFlag,_4>)QVar2.i;
  }
  __stack_chk_fail();
}

Assistant:

Qt::ItemFlags QUrlModel::flags(const QModelIndex &index) const
{
    Qt::ItemFlags flags = QStandardItemModel::flags(index);
    if (index.isValid()) {
        flags &= ~Qt::ItemIsEditable;
        // ### some future version could support "moving" urls onto a folder
        flags &= ~Qt::ItemIsDropEnabled;
    }

    if (index.data(Qt::DecorationRole).isNull())
        flags &= ~Qt::ItemIsEnabled;

    return flags;
}